

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void dwr_fighters_ring(dw_rom *rom)

{
  dw_rom *rom_local;
  
  printf("Fixing the fighter\'s ring...\n");
  vpatch(rom,0xf0fc,4,0x20,0x7d,0xff,0xea);
  vpatch(rom,0xff7d,0x11,0x85,0xcd,0xa5,0xcf,0x29,0x20,0xf0,6,0xa5,0xcc,0x69,2,0x85,0xcc,0x4c,0x54,
         0xff);
  vpatch(rom,0xff54,3,0xa5,0xcf,0x60);
  return;
}

Assistant:

static void dwr_fighters_ring(dw_rom *rom)
{

    printf("Fixing the fighter's ring...\n");
    /* fighter's ring fix */
    vpatch(rom, 0xf0fc, 4, 0x20, 0x7d, 0xff, 0xea);
    vpatch(rom, 0xff7d, 17,
        /* ff7d: */
        0x85, 0xcd,      /* STA $00CD  ; replaces code removed from $F00C    */
        0xa5, 0xcf,      /* LDA $00CF  ; load status bits                    */
        0x29, 0x20,      /* AND #$20   ; check bit 6 (fighter's ring)        */
        0xf0, 0x06,      /* BEQ $FF8B                                        */
        0xa5, 0xcc,      /* LDA $00CC  ; load attack power                   */
        0x69, 2,         /* ADC #$02   ; add fighter's ring power.           */
        0x85, 0xcc,      /* STA $00CC  ; store new attack power              */
        /* ff8b: */
        0x4c, 0x54, 0xff /* JMP $FF54  ; jump to next section                */
    );
    vpatch(rom, 0xff54, 3,
        /* ff54: */
        0xa5, 0xcf,      /* LDA $00CF   ; replaces code removed from $F00E   */
        0x60             /* RTS                                              */
    );
}